

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetMaxBacksIC(void *ida_mem,int maxbacks)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x330;
  }
  else {
    if (0 < maxbacks) {
      *(int *)((long)ida_mem + 0x48c) = maxbacks;
      return 0;
    }
    msgfmt = "maxbacks <= 0 illegal.";
    error_code = -0x16;
    line = 0x338;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetMaxBacksIC",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetMaxBacksIC(void* ida_mem, int maxbacks)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (maxbacks <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_BAD_MAXBACKS);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_maxbacks = maxbacks;

  return (IDA_SUCCESS);
}